

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::TextFlow::Columns::iterator::operator*[abi_cxx11_(iterator *this)

{
  char cVar1;
  const_iterator *pcVar2;
  const_reference this_00;
  const_iterator *pcVar3;
  undefined8 *in_RSI;
  string *in_RDI;
  string col;
  size_t width;
  size_t i;
  string padding;
  string *row;
  const_iterator *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  string local_b8 [112];
  const_iterator *local_48;
  const_iterator *local_40;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::string(local_38);
  local_40 = (const_iterator *)0x0;
  while( true ) {
    pcVar3 = local_40;
    pcVar2 = (const_iterator *)
             std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                       ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *
                        )*in_RSI);
    if (pcVar2 <= pcVar3) break;
    this_00 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
              operator[]((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                          *)*in_RSI,(size_type)local_40);
    local_48 = (const_iterator *)Column::width(this_00);
    std::
    vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
    ::operator[]((vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                  *)(in_RSI + 1),(size_type)local_40);
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::operator[]
              ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)*in_RSI,
               (size_type)local_40);
    Column::end((Column *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff17 =
         Column::const_iterator::operator!=
                   ((const_iterator *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                    in_stack_ffffffffffffff08);
    if ((bool)in_stack_ffffffffffffff17) {
      std::
      vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
      ::operator[]((vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                    *)(in_RSI + 1),(size_type)local_40);
      Column::const_iterator::operator*[abi_cxx11_(pcVar3);
      std::__cxx11::string::operator+=((string *)in_RDI,local_38);
      std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
      std::__cxx11::string::clear();
      pcVar3 = (const_iterator *)std::__cxx11::string::size();
      if (pcVar3 < local_48) {
        in_stack_ffffffffffffff08 = local_48;
        cVar1 = std::__cxx11::string::size();
        std::__cxx11::string::append((ulong)local_38,(char)in_stack_ffffffffffffff08 - cVar1);
      }
      std::__cxx11::string::~string(local_b8);
    }
    else {
      std::__cxx11::string::append((ulong)local_38,(char)local_48);
    }
    local_40 = (const_iterator *)((long)&local_40->m_column + 1);
  }
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string Columns::iterator::operator*() const {
            std::string row, padding;

            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                const auto width = m_columns[i].width();
                if ( m_iterators[i] != m_columns[i].end() ) {
                    std::string col = *m_iterators[i];
                    row += padding;
                    row += col;

                    padding.clear();
                    if ( col.size() < width ) {
                        padding.append( width - col.size(), ' ' );
                    }
                } else {
                    padding.append( width, ' ' );
                }
            }
            return row;
        }